

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi_serial_unix.cxx
# Opt level: O1

int ndiSerialCheckDSR(int serial_port)

{
  int iVar1;
  uint uVar2;
  int bits;
  uint local_c;
  
  iVar1 = ioctl(serial_port,0x5415,&local_c);
  uVar2 = 1;
  if (-1 < iVar1) {
    uVar2 = local_c >> 8 & 1;
  }
  return uVar2;
}

Assistant:

ndicapiExport int ndiSerialCheckDSR(int serial_port)
{
#if defined(linux) || defined(__linux__)
  int bits;
  /* get the bits to see if DSR is set (i.e. if device is connected) */
  if (ioctl(serial_port, TIOCMGET, &bits) >= 0)
  {
    return ((bits & TIOCM_DSR) != 0);
  }
#endif
  /* if called failed for any reason, return success for robustness */
  return 1;
}